

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O2

bool __thiscall
booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<char>_>::
valid_offset(boundary_point_index_iterator<std::_List_iterator<char>_> *this,size_t offset)

{
  element_type *peVar1;
  long lVar2;
  bool bVar3;
  
  bVar3 = true;
  if ((offset != 0) &&
     (peVar1 = (this->map_->index_).
               super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,
     lVar2 = (long)(peVar1->
                   super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                   )._M_impl.super__Vector_impl_data._M_start,
     offset + 1 <
     (ulong)((long)(peVar1->
                   super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                   )._M_impl.super__Vector_impl_data._M_finish - lVar2 >> 4))) {
    bVar3 = (*(uint *)(lVar2 + 8 + offset * 0x10) & this->mask_) != 0;
  }
  return bVar3;
}

Assistant:

bool valid_offset(size_t offset) const
                    {
                        return  offset == 0 
                                || offset + 1 >= size() // last and first are always valid regardless of mark
                                || (index()[offset].rule & mask_)!=0;
                    }